

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

int __thiscall ncnn::Clip::forward_inplace(Clip *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long *in_RSI;
  long lVar6;
  long in_RDI;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  int local_158;
  int local_f8;
  
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar4 = in_RSI[6];
  iVar3 = *(int *)((long)in_RSI + 0x34);
  lVar5 = in_RSI[7];
  for (local_f8 = 0; local_f8 < (int)lVar5; local_f8 = local_f8 + 1) {
    lVar6 = *in_RSI + in_RSI[8] * (long)local_f8 * in_RSI[2];
    for (local_158 = 0; local_158 < iVar2 * (int)lVar4 * iVar3; local_158 = local_158 + 1) {
      if (*(float *)(lVar6 + (long)local_158 * 4) < *(float *)(in_RDI + 0xd0)) {
        *(undefined4 *)(lVar6 + (long)local_158 * 4) = *(undefined4 *)(in_RDI + 0xd0);
      }
      fVar1 = *(float *)(lVar6 + (long)local_158 * 4);
      if (*(float *)(in_RDI + 0xd4) <= fVar1 && fVar1 != *(float *)(in_RDI + 0xd4)) {
        *(undefined4 *)(lVar6 + (long)local_158 * 4) = *(undefined4 *)(in_RDI + 0xd4);
      }
    }
  }
  return 0;
}

Assistant:

int Clip::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < min)
                ptr[i] = min;
            if (ptr[i] > max)
                ptr[i] = max;
        }
    }

    return 0;
}